

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

void __thiscall spirv_cross::CompilerMSL::emit_header(CompilerMSL *this)

{
  size_type sVar1;
  _Base_ptr p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts;
  long lVar3;
  key_type local_1c;
  
  if (this->suppress_missing_prototypes == true) {
    CompilerGLSL::statement<char_const(&)[56]>
              (&this->super_CompilerGLSL,
               (char (*) [56])"#pragma clang diagnostic ignored \"-Wmissing-prototypes\"");
  }
  local_1c = SPVFuncImplUnsafeArray;
  sVar1 = ::std::
          set<spirv_cross::CompilerMSL::SPVFuncImpl,_std::less<spirv_cross::CompilerMSL::SPVFuncImpl>,_std::allocator<spirv_cross::CompilerMSL::SPVFuncImpl>_>
          ::count(&this->spv_function_implementations,&local_1c);
  if (sVar1 != 0) {
    CompilerGLSL::statement<char_const(&)[52]>
              (&this->super_CompilerGLSL,
               (char (*) [52])"#pragma clang diagnostic ignored \"-Wmissing-braces\"");
  }
  for (p_Var2 = (this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->pragma_lines)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2)) {
    CompilerGLSL::statement<std::__cxx11::string_const&>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1));
  }
  if (((this->pragma_lines)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) ||
     (this->suppress_missing_prototypes == true)) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
  }
  CompilerGLSL::statement<char_const(&)[24]>
            (&this->super_CompilerGLSL,(char (*) [24])"#include <metal_stdlib>");
  CompilerGLSL::statement<char_const(&)[23]>
            (&this->super_CompilerGLSL,(char (*) [23])"#include <simd/simd.h>");
  ts = (this->super_CompilerGLSL).header_lines.
       super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       .ptr;
  for (lVar3 = (this->super_CompilerGLSL).header_lines.
               super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .buffer_size << 5; lVar3 != 0; lVar3 = lVar3 + -0x20) {
    CompilerGLSL::statement<std::__cxx11::string&>(&this->super_CompilerGLSL,ts);
    ts = ts + 1;
  }
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
  CompilerGLSL::statement<char_const(&)[23]>
            (&this->super_CompilerGLSL,(char (*) [23])"using namespace metal;");
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
  for (p_Var2 = (this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->typedef_lines)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)::std::_Rb_tree_increment(p_Var2)) {
    CompilerGLSL::statement<std::__cxx11::string_const&>
              (&this->super_CompilerGLSL,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 1));
  }
  if ((this->typedef_lines)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x303078);
  }
  return;
}

Assistant:

void CompilerMSL::emit_header()
{
	// This particular line can be overridden during compilation, so make it a flag and not a pragma line.
	if (suppress_missing_prototypes)
		statement("#pragma clang diagnostic ignored \"-Wmissing-prototypes\"");

	// Disable warning about missing braces for array<T> template to make arrays a value type
	if (spv_function_implementations.count(SPVFuncImplUnsafeArray) != 0)
		statement("#pragma clang diagnostic ignored \"-Wmissing-braces\"");

	for (auto &pragma : pragma_lines)
		statement(pragma);

	if (!pragma_lines.empty() || suppress_missing_prototypes)
		statement("");

	statement("#include <metal_stdlib>");
	statement("#include <simd/simd.h>");

	for (auto &header : header_lines)
		statement(header);

	statement("");
	statement("using namespace metal;");
	statement("");

	for (auto &td : typedef_lines)
		statement(td);

	if (!typedef_lines.empty())
		statement("");
}